

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCifar10.cpp
# Opt level: O3

bool testCifar10(void)

{
  bool bVar1;
  Dnn *this;
  unsigned_long uVar2;
  char *format;
  
  tfs::report_message("Info ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testCifar10.cpp"
                      ,"localTestCifar10",0x20,"Test Cifar10 - Start");
  this = (Dnn *)operator_new(0x40);
  tfs::Dnn::Dnn(this,true);
  bVar1 = tfs::Dnn::addLayerInput(this,0x20,0x20,3,false);
  if (bVar1) {
    bVar1 = tfs::Dnn::addLayerConvolution(this,5,0x10,1,2);
    if (bVar1) {
      bVar1 = tfs::Dnn::addLayerRectifiedLinearUnit(this);
      if (bVar1) {
        bVar1 = tfs::Dnn::addLayerPool(this,2,2,0);
        if (bVar1) {
          bVar1 = tfs::Dnn::addLayerConvolution(this,5,0x14,1,2);
          if (bVar1) {
            bVar1 = tfs::Dnn::addLayerRectifiedLinearUnit(this);
            if (bVar1) {
              bVar1 = tfs::Dnn::addLayerPool(this,2,2,0);
              if (bVar1) {
                bVar1 = tfs::Dnn::addLayerConvolution(this,5,0x14,1,2);
                if (bVar1) {
                  bVar1 = tfs::Dnn::addLayerRectifiedLinearUnit(this);
                  if (bVar1) {
                    bVar1 = tfs::Dnn::addLayerPool(this,2,2,0);
                    if (bVar1) {
                      bVar1 = tfs::Dnn::addLayerFullyConnected(this,10);
                      if (bVar1) {
                        bVar1 = tfs::Dnn::addLayerSoftmax(this);
                        if (bVar1) {
                          uVar2 = tfs::Dnn::count(this);
                          if (uVar2 == 0xc) {
                            tfs::Dnn::initialize(this);
                            (*this->_vptr_Dnn[1])(this);
                            tfs::report_message("Info ",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testCifar10.cpp"
                                                ,"localTestCifar10",0x52,"Test Cifar10 - End");
                            bVar1 = true;
                          }
                          else {
                            bVar1 = tfs::report_problem("Error",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testCifar10.cpp"
                                                  ,"localTestCifar10",0x4d,
                                                  "We have set up %lu layers, expected %lu",uVar2,
                                                  0xc);
                          }
                          return bVar1;
                        }
                        format = "Cannot add Softmax layer";
                        uVar2 = 0x48;
                      }
                      else {
                        format = "Cannot add Fully Connected layer";
                        uVar2 = 0x45;
                      }
                    }
                    else {
                      format = "Cannot add Pool layer";
                      uVar2 = 0x41;
                    }
                  }
                  else {
                    format = "Cannot add ReLu layer";
                    uVar2 = 0x3e;
                  }
                }
                else {
                  format = "Cannot add Convolution layer";
                  uVar2 = 0x3b;
                }
              }
              else {
                format = "Cannot add Pool layer";
                uVar2 = 0x37;
              }
            }
            else {
              format = "Cannot add ReLu layer";
              uVar2 = 0x34;
            }
          }
          else {
            format = "Cannot add Convolution layer";
            uVar2 = 0x31;
          }
        }
        else {
          format = "Cannot add Pool layer";
          uVar2 = 0x2d;
        }
      }
      else {
        format = "Cannot add ReLu layer";
        uVar2 = 0x2a;
      }
    }
    else {
      format = "Cannot add Convolution layer";
      uVar2 = 0x27;
    }
  }
  else {
    format = "Cannot add Input layer";
    uVar2 = 0x23;
  }
  bVar1 = tfs::report_problem("Error",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testCifar10.cpp"
                              ,"localTestCifar10",uVar2,format);
  return bVar1;
}

Assistant:

static bool
    localTestCifar10( void ) {
        // Taking an example from ConvNetJS cifar10: http://cs.stanford.edu/people/karpathy/convnetjs/demo/cifar10.html
        //        layer_defs = [];
        //        layer_defs.push({type:'input', out_sx:32, out_sy:32, out_depth:3});
        //        layer_defs.push({type:'conv', sx:5, filters:16, stride:1, pad:2, activation:'relu'});
        //        layer_defs.push({type:'pool', sx:2, stride:2});
        //        layer_defs.push({type:'conv', sx:5, filters:20, stride:1, pad:2, activation:'relu'});
        //        layer_defs.push({type:'pool', sx:2, stride:2});
        //        layer_defs.push({type:'conv', sx:5, filters:20, stride:1, pad:2, activation:'relu'});
        //        layer_defs.push({type:'pool', sx:2, stride:2});
        //        layer_defs.push({type:'softmax', num_classes:10});
        //
        //        net = new convnetjs.Net();
        //        net.makeLayers(layer_defs);
        //
        //        trainer = new convnetjs.SGDTrainer(net, {method:'adadelta', batch_size:4, l2_decay:0.0001});
        log_info( "Test Cifar10 - Start" );
        Dnn *dnn = new Dnn();
        if( !dnn->addLayerInput( 32, 32, 3 )) {             // Input layer for 32x32 RGB image
            return log_error( "Cannot add Input layer" );
        }
        // Convolution / Activation / Pool set:
        if( !dnn->addLayerConvolution( 5, 16, 1, 2 )) {     // 16 5x5 filters for convolution
            return log_error( "Cannot add Convolution layer" );
        }
        if( !dnn->addLayerRectifiedLinearUnit()) {          // Activation function for previous layer.
            return log_error( "Cannot add ReLu layer" );
        }
        if( !dnn->addLayerPool( 2, 2 )) {
            return log_error( "Cannot add Pool layer" );
        }
        // Convolution / Activation / Pool set:
        if( !dnn->addLayerConvolution( 5, 20, 1, 2 )) {     // 20 5x5 filters for convolution
            return log_error( "Cannot add Convolution layer" );
        }
        if( !dnn->addLayerRectifiedLinearUnit()) {          // Activation function for previous layer.
            return log_error( "Cannot add ReLu layer" );
        }
        if( !dnn->addLayerPool( 2, 2 )) {
            return log_error( "Cannot add Pool layer" );
        }
        // Convolution / Activation / Pool set:
        if( !dnn->addLayerConvolution( 5, 20, 1, 2 )) {     // 20 5x5 filters for convolution
            return log_error( "Cannot add Convolution layer" );
        }
        if( !dnn->addLayerRectifiedLinearUnit()) {          // Activation function for previous layer.
            return log_error( "Cannot add ReLu layer" );
        }
        if( !dnn->addLayerPool( 2, 2 )) {
            return log_error( "Cannot add Pool layer" );
        }
        // Fully connected layer with softmax:
        if( !dnn->addLayerFullyConnected( 10 )) {               //  1, 1, 10
            return log_error( "Cannot add Fully Connected layer" );
        }
        if( !dnn->addLayerSoftmax()) {                          // Output classifier
            return log_error( "Cannot add Softmax layer" );
        }
        const unsigned long expected_count = 12;
        const unsigned long count = dnn->count();
        if( count != expected_count ) {
            return log_error( "We have set up %lu layers, expected %lu", count, expected_count );
        }
        dnn->initialize();
        
        delete dnn;
        log_info( "Test Cifar10 - End" );
        return true;
    }